

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t
b_find_first_greater_or_equal
          (ion_bpp_handle_t handle,void *key,void *mkey,ion_bpp_external_address_t *rec)

{
  ion_bpp_address_t adr;
  int iVar1;
  ion_bpp_err_t iVar2;
  ion_bpp_h_node_t *h;
  int cc;
  ion_bpp_err_t rc;
  ion_bpp_buffer_t *buf;
  ion_bpp_key_t *lgeqkey;
  ion_bpp_external_address_t *rec_local;
  void *mkey_local;
  void *key_local;
  ion_bpp_handle_t handle_local;
  
  _cc = (ion_bpp_buffer_t *)((long)handle + 0x20);
  lgeqkey = (ion_bpp_key_t *)rec;
  rec_local = (ion_bpp_external_address_t *)mkey;
  mkey_local = key;
  key_local = handle;
  do {
    while( true ) {
      if ((undefined1  [40])((undefined1  [40])*_cc->p & (undefined1  [40])0x1) !=
          (undefined1  [40])0x0) {
        iVar1 = search(key_local,_cc,mkey_local,0,(ion_bpp_key_t **)&buf,MODE_LLEQ);
        if (0 < iVar1) {
          if (((long)buf - (long)&_cc->p->fkey) / (long)*(int *)((long)handle + 0xbc) ==
              (ulong)(*(ushort *)_cc->p >> 1)) {
            return bErrKeyNotFound;
          }
          buf = (ion_bpp_buffer_t *)((long)&buf->next + (long)*(int *)((long)handle + 0xbc));
        }
        *(ion_bpp_buffer_t **)((long)handle + 0xa8) = _cc;
        *(ion_bpp_buffer_t **)((long)handle + 0xb0) = buf;
        memcpy(rec_local,buf,(long)*(int *)((long)handle + 8));
        *(undefined8 *)lgeqkey =
             *(undefined8 *)((long)&buf->next + (long)*(int *)((long)handle + 8));
        return bErrOk;
      }
      iVar1 = search(key_local,_cc,mkey_local,0,(ion_bpp_key_t **)&buf,MODE_LLEQ);
      if (iVar1 < 0) break;
      iVar2 = readDisk(key_local,
                       *(ion_bpp_address_t *)((long)&buf->prev + (long)*(int *)((long)handle + 8)),
                       (ion_bpp_buffer_t **)&cc);
      if (iVar2 != bErrOk) {
        return iVar2;
      }
    }
    adr._0_4_ = buf[-1].valid;
    adr._4_4_ = buf[-1].modified;
    iVar2 = readDisk(key_local,adr,(ion_bpp_buffer_t **)&cc);
  } while (iVar2 == bErrOk);
  return iVar2;
}

Assistant:

ion_bpp_err_t
b_find_first_greater_or_equal(
	ion_bpp_handle_t			handle,
	void						*key,
	void						*mkey,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_key_t		*lgeqkey;			/* matched key */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */
	int					cc;

	ion_bpp_h_node_t *h = handle;

	buf = &h->root;

	/* find key, and return address */
	while (1) {
		if (leaf(buf)) {
			if ((cc = search(handle, buf, key, 0, &lgeqkey, MODE_LLEQ)) > 0) {
				if ((lgeqkey - fkey(buf)) / (h->ks) == (ct(buf))) {
					return bErrKeyNotFound;
				}

				lgeqkey += ks(1);
			}

			h->curBuf	= buf;
			h->curKey	= lgeqkey;
			memcpy(mkey, key(lgeqkey), h->keySize);
			*rec		= rec(lgeqkey);

			return bErrOk;
		}
		else {
			cc = search(handle, buf, key, 0, &lgeqkey, MODE_LLEQ);

			if (cc < 0) {
				if ((rc = readDisk(handle, childLT(lgeqkey), &buf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(lgeqkey), &buf)) != 0) {
					return rc;
				}
			}
		}
	}
}